

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

ssize_t __thiscall
vm_httpreq_cookie::send(vm_httpreq_cookie *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ulong uVar1;
  ssize_t sVar2;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  undefined4 in_register_00000034;
  TadsServerThread *this_00;
  bool local_11;
  
  this_00 = (TadsServerThread *)CONCAT44(in_register_00000034,__fd);
  uVar1 = TadsServerThread::send(this_00,0x3a92b6,__buf,__n,__flags);
  local_11 = false;
  if ((int)uVar1 != 0) {
    uVar1 = TadsServerThread::send(this_00,(int)this->name,__buf_00,uVar1 & 0xffffffff,__flags);
    local_11 = false;
    if ((int)uVar1 != 0) {
      uVar1 = TadsServerThread::send(this_00,0x3d7827,__buf_01,uVar1 & 0xffffffff,__flags);
      local_11 = false;
      if ((int)uVar1 != 0) {
        uVar1 = TadsServerThread::send(this_00,(int)this->val,__buf_02,uVar1 & 0xffffffff,__flags);
        local_11 = false;
        if ((int)uVar1 != 0) {
          sVar2 = TadsServerThread::send(this_00,0x3a9435,__buf_03,uVar1 & 0xffffffff,__flags);
          local_11 = (int)sVar2 != 0;
        }
      }
    }
  }
  return (ulong)local_11;
}

Assistant:

int vm_httpreq_cookie::send(TadsServerThread *t)
{
    /* send the Set-Cookie header */
    return (t->send("Set-Cookie: ")
            && t->send(name)
            && t->send("=")
            && t->send(val)
            && t->send("\r\n"));
}